

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOrder.c
# Opt level: O2

void Aig_ManOrderStart(Aig_Man_t *p)

{
  uint __line;
  uint *__s;
  void *pvVar1;
  int iVar2;
  char *__assertion;
  int iVar3;
  Vec_Ptr_t *p_00;
  
  if (p->nObjs[4] == 0) {
    if (p->pOrderData == (uint *)0x0) {
      p_00 = p->vObjs;
      iVar3 = p_00->nSize;
      iVar2 = 0x1000;
      if (0x7ff < iVar3) {
        iVar2 = iVar3 * 2;
      }
      p->nOrderAlloc = iVar2;
      __s = (uint *)malloc((long)(iVar2 * 2) << 2);
      p->pOrderData = __s;
      memset(__s,0xff,(long)iVar2 << 3);
      __s[0] = 0;
      __s[1] = 0;
      p->iPrev = 0;
      p->iNext = 0;
      for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
        pvVar1 = Vec_PtrEntry(p_00,iVar2);
        if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
          Aig_ObjOrderInsert(p,*(int *)((long)pvVar1 + 0x24));
        }
        p_00 = p->vObjs;
        iVar3 = p_00->nSize;
      }
      return;
    }
    __assertion = "p->pOrderData == NULL";
    __line = 0x33;
  }
  else {
    __assertion = "Aig_ManBufNum(p) == 0";
    __line = 0x31;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOrder.c"
                ,__line,"void Aig_ManOrderStart(Aig_Man_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Initializes the order datastructure.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Aig_ManOrderStart( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManBufNum(p) == 0 );
    // allocate order datastructure
    assert( p->pOrderData == NULL );
    p->nOrderAlloc = 2 * Aig_ManObjNumMax(p);
    if ( p->nOrderAlloc < (1<<12) )
        p->nOrderAlloc = (1<<12);
    p->pOrderData = ABC_ALLOC( unsigned, 2 * p->nOrderAlloc );
    memset( p->pOrderData, 0xFF, sizeof(unsigned) * 2 * p->nOrderAlloc );
    // add the constant node
    p->pOrderData[0] = p->pOrderData[1] = 0;
    p->iPrev = p->iNext = 0;
    // add the internal nodes
    Aig_ManForEachNode( p, pObj, i )
        Aig_ObjOrderInsert( p, pObj->Id );
}